

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t zetGetDeviceProcAddrTable(ze_api_version_t version,zet_device_dditable_t *pDdiTable)

{
  ze_result_t result;
  zet_device_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (zet_device_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (driver::context < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    pDdiTable->pfnGetDebugProperties = driver::zetDeviceGetDebugProperties;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetDeviceProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_device_dditable_t* pDdiTable                ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGetDebugProperties                     = driver::zetDeviceGetDebugProperties;

    return result;
}